

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChElementShellBST.cpp
# Opt level: O2

void __thiscall
chrono::fea::ChElementShellBST::ComputeNF
          (ChElementShellBST *this,double U,double V,double W,ChVectorDynamic<> *Qi,double *detJ,
          ChVectorDynamic<> *F,ChVectorDynamic<> *state_x,ChVectorDynamic<> *state_w)

{
  ShapeVector N;
  VectorBlock<Eigen::Matrix<double,__1,_1,_0,__1,_1>,__1> local_100;
  StorageBaseType local_c8 [56];
  CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>,_const_Eigen::Block<const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,__1,_1,_false>_>
  local_90;
  
  N.super_PlainObjectBase<Eigen::Matrix<double,_1,_3,_1,_1,_3>_>.m_storage.m_data.array[2] =
       (1.0 - U) - V;
  *detJ = this->tot_thickness * this->area;
  N.super_PlainObjectBase<Eigen::Matrix<double,_1,_3,_1,_1,_3>_>.m_storage.m_data.array[0] = U;
  N.super_PlainObjectBase<Eigen::Matrix<double,_1,_3,_1,_1,_3>_>.m_storage.m_data.array[1] = V;
  Eigen::DenseBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>::setZero
            ((DenseBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> *)Qi);
  Eigen::VectorBlock<const_Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_-1>::VectorBlock
            ((VectorBlock<const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,__1> *)local_c8,F,0,3);
  Eigen::operator*(&local_90,(double *)&N,local_c8);
  Eigen::VectorBlock<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_-1>::VectorBlock(&local_100,Qi,0,3);
  Eigen::internal::
  call_assignment<Eigen::Block<Eigen::Matrix<double,_1,1,0,_1,1>,_1,1,false>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,_1,1,0,_1,1>const>const,Eigen::Block<Eigen::Matrix<double,_1,1,0,_1,1>const,_1,1,false>const>>
            (&local_100.super_Block<Eigen::Matrix<double,__1,_1,_0,__1,_1>,__1,_1,_false>,&local_90)
  ;
  Eigen::VectorBlock<const_Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_-1>::VectorBlock
            ((VectorBlock<const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,__1> *)local_c8,F,0,3);
  Eigen::operator*(&local_90,
                   N.super_PlainObjectBase<Eigen::Matrix<double,_1,_3,_1,_1,_3>_>.m_storage.m_data.
                   array + 1,local_c8);
  Eigen::VectorBlock<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_-1>::VectorBlock(&local_100,Qi,3,3);
  Eigen::internal::
  call_assignment<Eigen::Block<Eigen::Matrix<double,_1,1,0,_1,1>,_1,1,false>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,_1,1,0,_1,1>const>const,Eigen::Block<Eigen::Matrix<double,_1,1,0,_1,1>const,_1,1,false>const>>
            (&local_100.super_Block<Eigen::Matrix<double,__1,_1,_0,__1,_1>,__1,_1,_false>,&local_90)
  ;
  Eigen::VectorBlock<const_Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_-1>::VectorBlock
            ((VectorBlock<const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,__1> *)local_c8,F,0,3);
  Eigen::operator*(&local_90,
                   N.super_PlainObjectBase<Eigen::Matrix<double,_1,_3,_1,_1,_3>_>.m_storage.m_data.
                   array + 2,local_c8);
  Eigen::VectorBlock<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_-1>::VectorBlock(&local_100,Qi,6,3);
  Eigen::internal::
  call_assignment<Eigen::Block<Eigen::Matrix<double,_1,1,0,_1,1>,_1,1,false>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,_1,1,0,_1,1>const>const,Eigen::Block<Eigen::Matrix<double,_1,1,0,_1,1>const,_1,1,false>const>>
            (&local_100.super_Block<Eigen::Matrix<double,__1,_1,_0,__1,_1>,__1,_1,_false>,&local_90)
  ;
  return;
}

Assistant:

void ChElementShellBST::ComputeNF(
    const double U,              // parametric coordinate in volume
    const double V,              // parametric coordinate in volume
    const double W,              // parametric coordinate in volume
    ChVectorDynamic<>& Qi,       // Return result of N'*F  here, maybe with offset block_offset
    double& detJ,                // Return det[J] here
    const ChVectorDynamic<>& F,  // Input F vector, size is = n.field coords.
    ChVectorDynamic<>* state_x,  // if != 0, update state (pos. part) to this, then evaluate Q
    ChVectorDynamic<>* state_w   // if != 0, update state (speed part) to this, then evaluate Q
    ) {
    ShapeVector N;
    ShapeFunctions(N, U, V);

	detJ = GetThickness() * this->area; 
	// simplified from: 
	//   detJ = GetThickness() * this->area * 2 * 1/2
	// where ..* 2  stems from the fact that for triangles in natural coordinates [0..+1] the det_tri[J] is area*2
	// where ..*1/2 stems from the fact that the thickness integration runs in [-1..+1], so det_thick[J] is thickness*1/2

	Qi.setZero();

    Qi.segment(0,3) = N(0) * F.segment(0,3);

    Qi.segment(3, 3) = N(1) * F.segment(0, 3);

    Qi.segment(6, 3) = N(2) * F.segment(0, 3);
}